

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

bool BinaryenGetMemorySegmentPassive(BinaryenModuleRef module,BinaryenIndex id)

{
  pointer puVar1;
  Fatal local_198;
  
  puVar1 = (module->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)id <
      (ulong)((long)(module->dataSegments).
                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (bool)*(undefined1 *)
                  ((long)puVar1[id]._M_t.
                         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                         ._M_t + 0x28);
  }
  wasm::Fatal::Fatal(&local_198);
  wasm::Fatal::operator<<(&local_198,(char (*) [20])"invalid segment id.");
  wasm::Fatal::~Fatal(&local_198);
}

Assistant:

bool BinaryenGetMemorySegmentPassive(BinaryenModuleRef module,
                                     BinaryenIndex id) {
  const auto& segments = ((Module*)module)->dataSegments;
  if (segments.size() <= id) {
    Fatal() << "invalid segment id.";
  }
  return segments[id]->isPassive;
}